

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O2

bool __thiscall ON_RevSurface::Extend(ON_RevSurface *this,int dir,ON_Interval *domain)

{
  ON_Interval *this_00;
  ON_Interval *this_01;
  double dVar1;
  ON_Curve *pOVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  int iVar6;
  double *pdVar7;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  double in_XMM1_Qa;
  ON_Interval dom;
  ON_Interval a;
  
  if (1 < (uint)dir) {
    return false;
  }
  iVar6 = (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x30])();
  if ((char)iVar6 == '\0') {
    (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])(this);
    dom.m_t[0] = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    dom.m_t[1] = in_XMM1_Qa;
    dVar3 = ON_Interval::operator[](domain,0);
    pdVar7 = ON_Interval::operator[](&dom,0);
    dVar1 = *pdVar7;
    if (dVar3 < dVar1) {
      dVar4 = ON_Interval::operator[](domain,0);
      pdVar7 = ON_Interval::operator[](&dom,0);
      *pdVar7 = dVar4;
    }
    dVar4 = ON_Interval::operator[](domain,1);
    pdVar7 = ON_Interval::operator[](&dom,1);
    if (dVar4 < *pdVar7 || dVar4 == *pdVar7) {
      if (dVar1 <= dVar3) goto LAB_005aae7f;
    }
    else {
      dVar1 = ON_Interval::operator[](domain,1);
      pdVar7 = ON_Interval::operator[](&dom,1);
      *pdVar7 = dVar1;
    }
    iVar6 = 1 - dir;
    if (this->m_bTransposed == false) {
      iVar6 = dir;
    }
    if (iVar6 == 0) {
      this_00 = &this->m_t;
      pdVar7 = ON_Interval::operator[](&dom,0);
      dVar1 = ON_Interval::NormalizedParameterAt(this_00,*pdVar7);
      pdVar7 = ON_Interval::operator[](&dom,1);
      dVar3 = ON_Interval::NormalizedParameterAt(this_00,*pdVar7);
      ON_Interval::ON_Interval(&a);
      this_01 = &this->m_angle;
      dVar1 = ON_Interval::ParameterAt(this_01,dVar1);
      pdVar7 = ON_Interval::operator[](&a,0);
      *pdVar7 = dVar1;
      dVar1 = ON_Interval::ParameterAt(this_01,dVar3);
      pdVar7 = ON_Interval::operator[](&a,1);
      *pdVar7 = dVar1;
      dVar1 = ON_Interval::Length(&a);
      if (6.283185307412417 < dVar1) {
        pdVar7 = ON_Interval::operator[](&a,0);
        dVar1 = *pdVar7;
        pdVar7 = ON_Interval::operator[](&a,1);
        *pdVar7 = dVar1 + 6.283185307179586;
      }
      this_01->m_t[0] = a.m_t[0];
      (this->m_angle).m_t[1] = a.m_t[1];
      this_00->m_t[0] = dom.m_t[0];
      (this->m_t).m_t[1] = dom.m_t[1];
    }
    else {
      pOVar2 = this->m_curve;
      if ((pOVar2 == (ON_Curve *)0x0) ||
         (iVar6 = (*(pOVar2->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3d])(pOVar2,&dom),
         (char)iVar6 == '\0')) goto LAB_005aae7f;
    }
    ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
    ON_BoundingBox::Destroy(&this->m_bbox);
    ON_Geometry::BoundingBox((ON_BoundingBox *)&a,(ON_Geometry *)this);
    bVar5 = true;
  }
  else {
LAB_005aae7f:
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool ON_RevSurface::Extend(
      int dir,
      const ON_Interval& domain
      )
{
  if ( dir != 0 && dir != 1 ) 
    return false;
  if (IsClosed(dir)) 
    return false;
  bool do_it = false;
  ON_Interval dom = Domain(dir);
  if (domain[0] < dom[0])
  {
    dom[0] = domain[0];
    do_it = true;
  }
  
  if (domain[1] > dom[1])
  {
    dom[1] = domain[1];
    do_it = true;
  }

  if (!do_it) 
    return false;

  if ( m_bTransposed ) 
    dir = 1-dir;

  bool rc = false;

  if ( dir == 0 )
  {
    double t0 = m_t.NormalizedParameterAt(dom[0]);
    double t1 = m_t.NormalizedParameterAt(dom[1]);
    ON_Interval a;
    a[0] = m_angle.ParameterAt(t0);
    a[1] = m_angle.ParameterAt(t1);
    if (a.Length() > 2.0*ON_PI+ON_ZERO_TOLERANCE) a[1] = a[0]+2.0*ON_PI;
    m_angle = a;
    m_t = dom;
    rc = true;
  }
  else if ( dir == 1 && m_curve )
  {
    rc = m_curve->Extend(dom);
  }

  if ( rc )
  {
    DestroySurfaceTree();
    // update bounding box
    //ON_BoundingBox bbox0 = m_bbox;
    m_bbox.Destroy();
    BoundingBox();
  }
  return rc;
}